

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O0

string * MovementToStr_abi_cxx11_(Movement move)

{
  undefined8 in_RSI;
  string *in_RDI;
  string *s;
  string local_78 [20];
  int in_stack_ffffffffffffff9c;
  string local_58 [34];
  allocator local_36;
  undefined1 local_35;
  allocator local_25 [17];
  char local_14;
  char cStack_13;
  
  local_14 = (char)in_RSI;
  cStack_13 = (char)((ulong)in_RSI >> 8);
  if (local_14 == cStack_13) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"   0",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else {
    local_35 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
    IntToStr_abi_cxx11_(in_stack_ffffffffffffff9c);
    std::__cxx11::string::operator+=(in_RDI,local_58);
    std::__cxx11::string::~string(local_58);
    IntToStr_abi_cxx11_(in_stack_ffffffffffffff9c);
    std::__cxx11::string::operator+=(in_RDI,local_78);
    std::__cxx11::string::~string(local_78);
  }
  return in_RDI;
}

Assistant:

std::string MovementToStr (const Movement move ) {
	if (move.from == move.to) {
		return "   0";
	}
	std::string s = "";
	s += IntToStr (move.from);
	s += IntToStr (move.to);
	return s;
}